

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::setChild
          (PulseStyleDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  logic_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index < 4) {
    switch(index) {
    case 0:
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (*ppSVar7);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar6->super_SyntaxListBase).childCount;
      sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar9->field_0x2;
      NVar4.raw = (pvVar9->numFlags).raw;
      uVar5 = pvVar9->rawLen;
      pIVar2 = pvVar9->info;
      (this->keyword).kind = pvVar9->kind;
      (this->keyword).field_0x2 = uVar3;
      (this->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->keyword).rawLen = uVar5;
      (this->keyword).info = pIVar2;
      break;
    case 2:
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar8 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>>
                         (*ppSVar7);
      (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->inputs).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->inputs).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
      sVar1 = (pSVar8->elements).size_;
      (this->inputs).elements.data_ = (pSVar8->elements).data_;
      (this->inputs).elements.size_ = sVar1;
      break;
    case 3:
      pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar9->field_0x2;
      NVar4.raw = (pvVar9->numFlags).raw;
      uVar5 = pvVar9->rawLen;
      pIVar2 = pvVar9->info;
      (this->semi).kind = pvVar9->kind;
      (this->semi).field_0x2 = uVar3;
      (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->semi).rawLen = uVar5;
      (this->semi).info = pIVar2;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar10 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar10;
  psVar11 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar10[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
  }
  local_d0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x2a30);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar10;
  plVar12 = plVar10 + 2;
  if (local_b0 == plVar12) {
    local_a0 = *plVar12;
    lStack_98 = plVar10[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar12;
  }
  local_a8 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar10;
  plVar12 = plVar10 + 2;
  if (local_f0 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar10[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar12;
  }
  local_e8 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void PulseStyleDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: inputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}